

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O0

ON_BrepFace * __thiscall ON_BrepTrim::Face(ON_BrepTrim *this)

{
  int iVar1;
  int iVar2;
  ON_BrepLoop *pOVar3;
  ON_BrepFace *pOStack_18;
  int fi;
  ON_BrepFace *face;
  ON_BrepTrim *this_local;
  
  pOStack_18 = (ON_BrepFace *)0x0;
  if (((this->m_brep != (ON_Brep *)0x0) && (-1 < this->m_li)) &&
     (iVar1 = this->m_li,
     iVar2 = ON_ClassArray<ON_BrepLoop>::Count((ON_ClassArray<ON_BrepLoop> *)&this->m_brep->m_L),
     iVar1 < iVar2)) {
    pOVar3 = ON_ClassArray<ON_BrepLoop>::operator[]
                       ((ON_ClassArray<ON_BrepLoop> *)&this->m_brep->m_L,this->m_li);
    iVar1 = pOVar3->m_fi;
    if ((-1 < iVar1) &&
       (iVar2 = ON_ClassArray<ON_BrepFace>::Count((ON_ClassArray<ON_BrepFace> *)&this->m_brep->m_F),
       iVar1 < iVar2)) {
      pOStack_18 = ON_ClassArray<ON_BrepFace>::operator[]
                             ((ON_ClassArray<ON_BrepFace> *)&this->m_brep->m_F,iVar1);
    }
  }
  return pOStack_18;
}

Assistant:

ON_BrepFace* ON_BrepTrim::Face() const
{
  ON_BrepFace* face = 0;
  if ( m_brep && m_li >= 0 && m_li < m_brep->m_L.Count() )
  {
    int fi = m_brep->m_L[m_li].m_fi;
    if ( fi >= 0 && fi < m_brep->m_F.Count() )
      face = &m_brep->m_F[fi];
  }
  return face;
}